

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  value_type val1;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc98;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffca0;
  unsigned_long *in_stack_fffffffffffffca8;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcb0;
  key_equal *in_stack_fffffffffffffcb8;
  int line;
  undefined4 in_stack_fffffffffffffcc0;
  key_type in_stack_fffffffffffffcc4;
  char *in_stack_fffffffffffffcc8;
  Type type;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffcd0;
  value_type *in_stack_fffffffffffffd18;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd20;
  AssertionResult local_298 [3];
  value_type local_260;
  key_equal *local_248;
  AssertionResult local_240;
  key_type local_230;
  int local_22c;
  AssertHelper *local_218;
  AssertionResult local_210 [3];
  value_type local_1d4;
  int local_1cc;
  size_type local_1b8;
  AssertionResult local_1b0;
  key_type local_19c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_198 [11];
  int local_e0;
  int local_dc;
  AssertionResult local_d8 [3];
  value_type local_9c;
  key_type local_94;
  int local_90;
  int local_8c;
  size_type local_68;
  AssertionResult local_60 [3];
  value_type local_28;
  int local_20;
  key_type local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffca0,(float)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             SUB84(in_stack_fffffffffffffc98,0));
  local_1c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
  for (local_20 = 0; local_20 < 0x333; local_20 = local_20 + 1) {
    local_28 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffc98,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  local_68 = google::
             BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x101fa2f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(unsigned_long *)in_stack_fffffffffffffca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x101fa96);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcd0,
               (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
    testing::Message::~Message((Message *)0x101faf9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101fb6a);
  local_8c = google::
             HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  for (local_90 = 0; local_90 < 0x400; local_90 = local_90 + 1) {
    in_stack_fffffffffffffd20 =
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)(in_RDI + 0x10);
    local_94 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
    local_9c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffc98,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  local_dc = google::
             HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  local_e0 = local_8c + 2;
  testing::internal::CmpHelperLT<int,int>
            ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             (int *)in_stack_fffffffffffffca8,(int *)in_stack_fffffffffffffca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffd18 =
         (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0x101fcd1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcd0,
               (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
    testing::Message::~Message((Message *)0x101fd34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x101fda5);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffca0,
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffca0,
             (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_198,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8,
             (hasher *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             in_stack_fffffffffffffcb8,(allocator_type *)in_stack_fffffffffffffcb0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_198);
  local_19c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffca0,(float)((ulong)in_stack_fffffffffffffc98 >> 0x20),
             SUB84(in_stack_fffffffffffffc98,0));
  local_1b8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x101fe81);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(unsigned_long *)in_stack_fffffffffffffca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x101ff47);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffcd0,
               (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
    testing::Message::~Message((Message *)0x101ffa4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1020015);
  for (local_1cc = 0; local_1cc < 0x333; local_1cc = local_1cc + 1) {
    local_1d4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffc98,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  this_00 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x10200aa);
  local_218 = this_00;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8,(unsigned_long *)in_stack_fffffffffffffca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffcc8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x102011f);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
    testing::Message::~Message((Message *)0x102017c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10201ed);
  for (local_22c = 0; type = (Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20), local_22c < 0x333;
      local_22c = local_22c + 1) {
    in_stack_fffffffffffffcc4 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    local_230 = in_stack_fffffffffffffcc4;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
    in_stack_fffffffffffffcb8 =
         (key_equal *)
         google::
         BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0x1020254);
    local_248 = in_stack_fffffffffffffcb8;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffca8,(unsigned_long *)in_stack_fffffffffffffca0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffcb0 =
           (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x10202db);
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffca0);
      testing::Message::~Message((Message *)0x1020338);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10203a3);
  }
  val1 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffc98,0);
  local_260 = val1;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x102041d);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             (unsigned_long *)val1,(unsigned_long *)this_01);
  line = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x1020492);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               line,(char *)in_stack_fffffffffffffcb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd20,(Message *)in_stack_fffffffffffffd18);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x10204ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1020558);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x1020565);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}